

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O1

SurfaceInteraction * __thiscall
pbrt::Cylinder::InteractionFromIntersection
          (SurfaceInteraction *__return_storage_ptr__,Cylinder *this,QuadricIntersection *isect,
          Vector3f *wo,Float time)

{
  float fVar1;
  bool bVar2;
  bool bVar3;
  Transform *pTVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  SurfaceInteraction *pSVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  Point3f pHit;
  Vector3f dpdu;
  Tuple3<pbrt::Vector3,_float> local_1f0;
  SurfaceInteraction *local_1e0;
  Tuple3<pbrt::Normal3,_float> local_1d8;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  Tuple2<pbrt::Point2,_float> local_178;
  Tuple3<pbrt::Vector3,_float> local_170;
  Tuple3<pbrt::Vector3,_float> local_160;
  Tuple3<pbrt::Normal3,_float> local_150;
  Point3fi local_140;
  SurfaceInteraction local_128;
  
  pHit.super_Tuple3<pbrt::Point3,_float>.z = (isect->pObj).super_Tuple3<pbrt::Point3,_float>.z;
  pHit.super_Tuple3<pbrt::Point3,_float>.x = (isect->pObj).super_Tuple3<pbrt::Point3,_float>.x;
  pHit.super_Tuple3<pbrt::Point3,_float>.y = (isect->pObj).super_Tuple3<pbrt::Point3,_float>.y;
  local_188 = ZEXT416((uint)isect->phi);
  fVar1 = this->phiMax;
  local_1a8 = ZEXT416((uint)(pHit.super_Tuple3<pbrt::Point3,_float>.z - this->zMin));
  local_1f0.z = this->zMax - this->zMin;
  auVar11._8_4_ = 0x80000000;
  auVar11._0_8_ = 0x8000000080000000;
  auVar11._12_4_ = 0x80000000;
  local_198 = ZEXT416((uint)fVar1);
  auVar11 = vxorps_avx512vl(local_198,auVar11);
  dpdu.super_Tuple3<pbrt::Vector3,_float>.x =
       pHit.super_Tuple3<pbrt::Point3,_float>.y * auVar11._0_4_;
  dpdu.super_Tuple3<pbrt::Vector3,_float>.y = fVar1 * pHit.super_Tuple3<pbrt::Point3,_float>.x;
  dpdu.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  local_1f0.x = 0.0;
  local_1f0.y = 0.0;
  fVar1 = fVar1 * auVar11._0_4_;
  fVar6 = fVar1 * pHit.super_Tuple3<pbrt::Point3,_float>.x;
  fVar7 = fVar1 * pHit.super_Tuple3<pbrt::Point3,_float>.y;
  auVar12._0_12_ = ZEXT812(0);
  auVar12._12_4_ = 0;
  auVar15 = ZEXT416((uint)dpdu.super_Tuple3<pbrt::Vector3,_float>.x);
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)(dpdu.super_Tuple3<pbrt::Vector3,_float>.y *
                                          dpdu.super_Tuple3<pbrt::Vector3,_float>.y)),auVar15,
                            auVar15);
  fVar8 = dpdu.super_Tuple3<pbrt::Vector3,_float>.y * 0.0;
  auVar11 = vfmadd213ss_fma(ZEXT816(0) << 0x40,auVar15,ZEXT416((uint)fVar8));
  local_1b8 = ZEXT416((uint)local_1f0.z);
  auVar19 = vfmadd231ss_fma(auVar11,local_1b8,auVar12);
  auVar11 = vfmadd213ss_fma(local_1b8,local_1b8,auVar12);
  fVar5 = local_1f0.z * dpdu.super_Tuple3<pbrt::Vector3,_float>.y + 0.0;
  auVar15 = vfnmadd231ss_fma(ZEXT416((uint)(local_1f0.z * dpdu.super_Tuple3<pbrt::Vector3,_float>.x)
                                    ),auVar15,ZEXT416((uint)local_1f0.z));
  fVar14 = (0.0 - local_1f0.z * dpdu.super_Tuple3<pbrt::Vector3,_float>.x) + auVar15._0_4_;
  auVar15 = vfmsub213ss_fma(ZEXT416((uint)dpdu.super_Tuple3<pbrt::Vector3,_float>.x),auVar12,
                            ZEXT416((uint)fVar8));
  auVar16 = vfnmadd213ss_fma(ZEXT416((uint)dpdu.super_Tuple3<pbrt::Vector3,_float>.y),auVar12,
                             ZEXT416((uint)fVar8));
  fVar8 = auVar15._0_4_ + auVar16._0_4_;
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar14 * fVar14)),ZEXT416((uint)fVar5),
                            ZEXT416((uint)fVar5));
  auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)fVar8),ZEXT416((uint)fVar8));
  local_1e0 = __return_storage_ptr__;
  if (auVar15._0_4_ < 0.0) {
    local_1c8 = auVar11;
    fVar13 = sqrtf(auVar15._0_4_);
    auVar12 = ZEXT816(0) << 0x40;
    auVar18 = ZEXT416(auVar18._0_4_);
    auVar19 = ZEXT416(auVar19._0_4_);
    auVar11 = local_1c8;
  }
  else {
    auVar15 = vsqrtss_avx(auVar15,auVar15);
    fVar13 = auVar15._0_4_;
  }
  auVar15 = vfmadd213ss_fma(ZEXT416((uint)fVar6),ZEXT416((uint)(fVar5 / fVar13)),
                            ZEXT416((uint)(fVar7 * (fVar14 / fVar13))));
  auVar15 = vfmadd213ss_fma(ZEXT416((uint)(fVar1 * 0.0)),ZEXT416((uint)(fVar8 / fVar13)),auVar15);
  auVar16 = vfmadd231ss_fma(ZEXT416((uint)((fVar14 / fVar13) * 0.0)),auVar12,
                            ZEXT416((uint)(fVar5 / fVar13)));
  auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)(fVar8 / fVar13)),auVar12);
  auVar12 = vfmsub231ss_fma(ZEXT416((uint)(auVar19._0_4_ * auVar19._0_4_)),auVar18,auVar11);
  fVar14 = 1.0 / auVar12._0_4_;
  auVar12 = vfmsub231ss_fma(ZEXT416((uint)(auVar11._0_4_ * auVar15._0_4_)),auVar16,auVar19);
  fVar1 = fVar14 * auVar12._0_4_;
  auVar9._8_4_ = 0x80000000;
  auVar9._0_8_ = 0x8000000080000000;
  auVar9._12_4_ = 0x80000000;
  auVar12 = vxorps_avx512vl(auVar16,auVar9);
  auVar12 = ZEXT416((uint)(auVar18._0_4_ * auVar12._0_4_));
  auVar18 = vfmadd213ss_fma(auVar15,auVar19,auVar12);
  fVar5 = fVar14 * auVar18._0_4_;
  local_1d8.z = local_1f0.z * fVar5 + dpdu.super_Tuple3<pbrt::Vector3,_float>.z * fVar1;
  auVar17._0_4_ = dpdu.super_Tuple3<pbrt::Vector3,_float>.x * fVar1 + local_1f0.x * fVar5;
  auVar17._4_4_ = dpdu.super_Tuple3<pbrt::Vector3,_float>.y * fVar1 + local_1f0.y * fVar5;
  auVar17._8_4_ = fVar1 * 0.0 + fVar5 * 0.0;
  auVar17._12_4_ = fVar1 * 0.0 + fVar5 * 0.0;
  local_1d8._0_8_ = vmovlps_avx(auVar17);
  auVar11 = vfmsub231ss_fma(ZEXT416((uint)(auVar11._0_4_ * auVar16._0_4_)),auVar16,auVar19);
  fVar1 = fVar14 * auVar11._0_4_;
  auVar11 = vfmadd213ss_fma(auVar16,auVar19,auVar12);
  fVar14 = fVar14 * auVar11._0_4_;
  local_150.z = dpdu.super_Tuple3<pbrt::Vector3,_float>.z * fVar1 + local_1f0.z * fVar14;
  auVar15._0_4_ = dpdu.super_Tuple3<pbrt::Vector3,_float>.x * fVar1 + local_1f0.x * fVar14;
  auVar15._4_4_ = dpdu.super_Tuple3<pbrt::Vector3,_float>.y * fVar1 + local_1f0.y * fVar14;
  auVar15._8_4_ = fVar1 * 0.0 + fVar14 * 0.0;
  auVar15._12_4_ = fVar1 * 0.0 + fVar14 * 0.0;
  local_150._0_8_ = vmovlps_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_4_ = pHit.super_Tuple3<pbrt::Point3,_float>.x;
  auVar16._4_4_ = pHit.super_Tuple3<pbrt::Point3,_float>.y;
  auVar18._8_4_ = 0x7fffffff;
  auVar18._0_8_ = 0x7fffffff7fffffff;
  auVar18._12_4_ = 0x7fffffff;
  auVar11 = vandps_avx512vl(auVar16,auVar18);
  auVar19._8_4_ = 0x34400002;
  auVar19._0_8_ = 0x3440000234400002;
  auVar19._12_4_ = 0x34400002;
  auVar11 = vmulps_avx512vl(auVar11,auVar19);
  local_160._0_8_ = vmovlps_avx(auVar11);
  local_160.z = 0.0;
  bVar2 = this->reverseOrientation;
  bVar3 = this->transformSwapsHandedness;
  pTVar4 = this->objectFromRender;
  fVar1 = (wo->super_Tuple3<pbrt::Vector3,_float>).x;
  fVar5 = (wo->super_Tuple3<pbrt::Vector3,_float>).y;
  fVar14 = (wo->super_Tuple3<pbrt::Vector3,_float>).z;
  auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (pTVar4->m).m[0][1])),ZEXT416((uint)fVar1),
                            ZEXT416((uint)(pTVar4->m).m[0][0]));
  auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)fVar14),ZEXT416((uint)(pTVar4->m).m[0][2]));
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (pTVar4->m).m[1][1])),ZEXT416((uint)fVar1),
                            ZEXT416((uint)(pTVar4->m).m[1][0]));
  auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)fVar14),ZEXT416((uint)(pTVar4->m).m[1][2]));
  auVar11 = vinsertps_avx(auVar11,auVar18,0x10);
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (pTVar4->m).m[2][1])),ZEXT416((uint)fVar1),
                            ZEXT416((uint)(pTVar4->m).m[2][0]));
  auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)fVar14),ZEXT416((uint)(pTVar4->m).m[2][2]));
  local_170._0_8_ = vmovlps_avx(auVar11);
  local_170.z = auVar18._0_4_;
  pTVar4 = this->renderFromObject;
  Point3fi::Point3fi(&local_140,&pHit,(Vector3f *)&local_160);
  auVar11 = vinsertps_avx(local_188,ZEXT416((uint)local_1a8._0_4_),0x10);
  auVar18 = vinsertps_avx(local_198,ZEXT416((uint)local_1b8._0_4_),0x10);
  auVar11 = vdivps_avx(auVar11,auVar18);
  local_178 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar11);
  SurfaceInteraction::SurfaceInteraction
            (&local_128,&local_140,(Point2f *)&local_178,(Vector3f *)&local_170,&dpdu,
             (Vector3f *)&local_1f0,(Normal3f *)&local_1d8,(Normal3f *)&local_150,time,
             bVar2 != bVar3);
  pSVar10 = local_1e0;
  Transform::operator()(local_1e0,pTVar4,&local_128);
  return pSVar10;
}

Assistant:

InteractionFromIntersection(const QuadricIntersection &isect,
                                                   const Vector3f &wo, Float time) const {
        Point3f pHit = isect.pObj;
        Float phi = isect.phi;
        // Find parametric representation of cylinder hit
        Float u = phi / phiMax;
        Float v = (pHit.z - zMin) / (zMax - zMin);
        // Compute cylinder $\dpdu$ and $\dpdv$
        Vector3f dpdu(-phiMax * pHit.y, phiMax * pHit.x, 0);
        Vector3f dpdv(0, 0, zMax - zMin);

        // Compute cylinder $\dndu$ and $\dndv$
        Vector3f d2Pduu = -phiMax * phiMax * Vector3f(pHit.x, pHit.y, 0);
        Vector3f d2Pduv(0, 0, 0), d2Pdvv(0, 0, 0);
        // Compute coefficients for fundamental forms
        Float E = Dot(dpdu, dpdu);
        Float F = Dot(dpdu, dpdv);
        Float G = Dot(dpdv, dpdv);
        Vector3f N = Normalize(Cross(dpdu, dpdv));
        Float e = Dot(N, d2Pduu);
        Float f = Dot(N, d2Pduv);
        Float g = Dot(N, d2Pdvv);

        // Compute $\dndu$ and $\dndv$ from fundamental form coefficients
        Float invEGF2 = 1 / (E * G - F * F);
        Normal3f dndu =
            Normal3f((f * F - e * G) * invEGF2 * dpdu + (e * F - f * E) * invEGF2 * dpdv);
        Normal3f dndv =
            Normal3f((g * F - f * G) * invEGF2 * dpdu + (f * F - g * E) * invEGF2 * dpdv);

        // Compute error bounds for cylinder intersection
        Vector3f pError = gamma(3) * Abs(Vector3f(pHit.x, pHit.y, 0));

        // Return _SurfaceInteraction_ for quadric intersection
        bool flipNormal = reverseOrientation ^ transformSwapsHandedness;
        Vector3f woObject = (*objectFromRender)(wo);
        return (*renderFromObject)(SurfaceInteraction(Point3fi(pHit, pError),
                                                      Point2f(u, v), woObject, dpdu, dpdv,
                                                      dndu, dndv, time, flipNormal));
    }